

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  ParamIterator<BLOCK_SIZE> *in_RDI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *unaff_retaddr;
  
  std::
  get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
              *)0xacfcdc);
  ParamIterator<BLOCK_SIZE>::operator++(in_RDI);
  CartesianProductGenerator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::AdvanceIfEnd<1ul>(this);
  ComputeCurrentValue(unaff_retaddr);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }